

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadLiteralSelector.hpp
# Opt level: O3

void __thiscall
Kernel::LookaheadLiteralSelector::LookaheadLiteralSelector
          (LookaheadLiteralSelector *this,bool completeSelection,Ordering *ordering,Options *options
          )

{
  int iVar1;
  LiteralSelector *pLVar2;
  
  (this->super_LiteralSelector)._ord = ordering;
  (this->super_LiteralSelector)._opt = options;
  (this->super_LiteralSelector)._reversePolarity = false;
  (this->super_LiteralSelector)._vptr_LiteralSelector = (_func_int **)&PTR__LiteralSelector_00b3cb48
  ;
  (this->super_LiteralSelector).field_0x19 = completeSelection;
  iVar1 = (options->_lookaheadDelay).super_OptionValue<int>.actualValue;
  this->_delay = iVar1;
  this->_skipped = 0;
  if (iVar1 == 0) {
    pLVar2 = (LiteralSelector *)0x0;
  }
  else {
    iVar1 = 0x3f2;
    if (completeSelection) {
      iVar1 = 10;
    }
    pLVar2 = LiteralSelector::getSelector(ordering,options,iVar1);
  }
  this->_startupSelector = pLVar2;
  return;
}

Assistant:

LookaheadLiteralSelector(bool completeSelection, const Ordering& ordering, const Options& options)
  : LiteralSelector(ordering, options), _completeSelection(completeSelection)
  {
    _delay = options.lookaheadDelay();
    _skipped = 0;
    _startupSelector = (_delay==0) ? 0 : LiteralSelector::getSelector(ordering, options, completeSelection ? 10 : 1010);
  }